

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.cpp
# Opt level: O2

ifstream * __thiscall ev3dev::anon_unknown_20::ifstream_open(anon_unknown_20 *this,string *path)

{
  undefined8 *puVar1;
  __type _Var2;
  char cVar3;
  int iVar4;
  pointer p_Var5;
  _List_node_base *p_Var6;
  __allocated_ptr<std::allocator<std::_List_node<ev3dev::(anonymous_namespace)::lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_ifstream<char,_std::char_traits<char>_>_>::item>_>_>
  local_30;
  
  if ((anonymous_namespace)::ifstream_cache(std::__cxx11::string_const&)::cache_abi_cxx11_ == '\0')
  {
    iVar4 = __cxa_guard_acquire(&(anonymous_namespace)::ifstream_cache(std::__cxx11::string_const&)
                                 ::cache_abi_cxx11_);
    if (iVar4 != 0) {
      (anonymous_namespace)::ifstream_cache(std::__cxx11::string_const&)::cache_abi_cxx11_ = 0x10;
      path = (string *)
             &(anonymous_namespace)::ifstream_cache(std::__cxx11::string_const&)::cache_abi_cxx11_;
      DAT_0011eb70 = &DAT_0011eb68;
      DAT_0011eb68 = (_List_node_base *)&DAT_0011eb68;
      DAT_0011eb78 = 0;
      __cxa_atexit(lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_ifstream<char,_std::char_traits<char>_>_>
                   ::~lru_cache,
                   &(anonymous_namespace)::ifstream_cache(std::__cxx11::string_const&)::
                    cache_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::ifstream_cache(std::__cxx11::string_const&)::
                           cache_abi_cxx11_);
    }
  }
  std::mutex::lock((mutex *)(anonymous_namespace)::ifstream_cache(std::__cxx11::string_const&)::mx);
  p_Var6 = (_List_node_base *)&DAT_0011eb68;
  do {
    p_Var6 = p_Var6->_M_next;
    if (p_Var6 == (_List_node_base *)&DAT_0011eb68) goto LAB_00110e27;
    path = (string *)this;
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (p_Var6 + 1),
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            this);
  } while (!_Var2);
  if (p_Var6->_M_next != DAT_0011eb68 && DAT_0011eb68 != p_Var6) {
    std::__detail::_List_node_base::_M_transfer(DAT_0011eb68,p_Var6);
  }
LAB_00110e9c:
  p_Var6 = DAT_0011eb68 + 3;
  pthread_mutex_unlock
            ((pthread_mutex_t *)
             (anonymous_namespace)::ifstream_cache(std::__cxx11::string_const&)::mx);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
    std::ifstream::open((string *)p_Var6,(_Ios_Openmode)this);
  }
  else {
    std::ios::clear((int)p_Var6->_M_next[-2]._M_prev + (int)p_Var6);
    std::istream::seekg((long)p_Var6,_S_beg);
  }
  return (ifstream *)p_Var6;
LAB_00110e27:
  while (puVar1 = DAT_0011eb70,
        (anonymous_namespace)::ifstream_cache(std::__cxx11::string_const&)::cache_abi_cxx11_ <
        DAT_0011eb78 + 1U) {
    DAT_0011eb78 = DAT_0011eb78 + -1;
    std::__detail::_List_node_base::_M_unhook();
    std::
    allocator_traits<std::allocator<std::_List_node<ev3dev::(anonymous_namespace)::lru_cache<std::__cxx11::string,std::ifstream>::item>>>
    ::destroy<ev3dev::(anonymous_namespace)::lru_cache<std::__cxx11::string,std::ifstream>::item>
              ((allocator_type *)(puVar1 + 2),(item *)path);
    operator_delete(puVar1);
  }
  p_Var5 = (pointer)operator_new(0x238);
  local_30._M_alloc =
       (allocator<std::_List_node<ev3dev::(anonymous_namespace)::lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_ifstream<char,_std::char_traits<char>_>_>::item>_>
        *)&DAT_0011eb68;
  local_30._M_ptr = p_Var5;
  std::__cxx11::string::string((string *)&p_Var5->_M_storage,(string *)this);
  std::ifstream::ifstream((p_Var5->_M_storage)._M_storage + 0x20);
  local_30._M_ptr = (pointer)0x0;
  std::
  __allocated_ptr<std::allocator<std::_List_node<ev3dev::(anonymous_namespace)::lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_ifstream<char,_std::char_traits<char>_>_>::item>_>_>
  ::~__allocated_ptr(&local_30);
  std::__detail::_List_node_base::_M_hook((_List_node_base *)p_Var5);
  DAT_0011eb78 = DAT_0011eb78 + 1;
  goto LAB_00110e9c;
}

Assistant:

std::ifstream &ifstream_open(const std::string &path) {
    std::ifstream &file = ifstream_cache(path);
    if (!file.is_open()) {
        file.open(path);
    } else {
        // Clear the flags bits in case something happened (like reaching EOF).
        file.clear();
        file.seekg(0, std::ios::beg);
    }
    return file;
}